

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::BaseEmitter::onSettingsUpdated(BaseEmitter *this)

{
  bool bVar1;
  BaseEmitter *in_RDI;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  
  if (in_RDI->_code == (CodeHolder *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                    (in_RDI->_emitterFlags,kOwnLogger);
  if (!bVar1) {
    in_RDI->_logger = in_RDI->_code->_logger;
  }
  bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                    (in_RDI->_emitterFlags,kOwnErrorHandler);
  if (!bVar1) {
    in_RDI->_errorHandler = in_RDI->_code->_errorHandler;
  }
  BaseEmitter_updateForcedOptions(in_RDI);
  return;
}

Assistant:

void BaseEmitter::onSettingsUpdated() noexcept {
  // Only called when attached to CodeHolder by CodeHolder.
  ASMJIT_ASSERT(_code != nullptr);

  if (!hasOwnLogger())
    _logger = _code->logger();

  if (!hasOwnErrorHandler())
    _errorHandler = _code->errorHandler();

  BaseEmitter_updateForcedOptions(this);
}